

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

void __thiscall
AggressiveBotStrategy::AggressiveBotStrategy(AggressiveBotStrategy *this,Player *player)

{
  int *piVar1;
  Player *this_00;
  string *this_01;
  allocator<char> local_25 [13];
  Player *local_18;
  Player *player_local;
  AggressiveBotStrategy *this_local;
  
  local_18 = player;
  player_local = (Player *)this;
  PlayerStrategy::PlayerStrategy(&this->super_PlayerStrategy);
  (this->super_PlayerStrategy)._vptr_PlayerStrategy = (_func_int **)&PTR_yesOrNo_001688a8;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  (this->super_PlayerStrategy).armiesToPlace = piVar1;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  (this->super_PlayerStrategy).exchangingCardType = piVar1;
  this_00 = (Player *)operator_new(0x38);
  Player::Player(this_00,local_18);
  (this->super_PlayerStrategy).player = this_00;
  (this->super_PlayerStrategy).from = (Country *)0x0;
  (this->super_PlayerStrategy).to = (Country *)0x0;
  this_01 = (string *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this_01,"AGGRESSIVE",local_25);
  (this->super_PlayerStrategy).strategyName = this_01;
  std::allocator<char>::~allocator(local_25);
  return;
}

Assistant:

AggressiveBotStrategy::AggressiveBotStrategy(const Player& player) {
    this->armiesToPlace = new int(0);
    this->exchangingCardType = new int(0);
    this->player = new Player(player);
    this->from = nullptr;
    this->to = nullptr;
    this->strategyName = new std::string("AGGRESSIVE");
}